

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O2

void model_rd_for_sb_with_curvfit
               (AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
               int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
               int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  char cVar1;
  BLOCK_SIZE bsize_00;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  byte bVar5;
  uint bh;
  uint bw;
  long lVar6;
  int64_t iVar7;
  long lVar8;
  int block_height;
  undefined7 in_register_00000031;
  macroblock_plane *p;
  long lVar9;
  long lVar10;
  int block_width;
  macroblockd_plane *pd;
  double dVar11;
  double dVar12;
  double sse_norm;
  double local_40;
  double rate_f;
  
  cVar1 = (*xd->mi)->ref_frame[0];
  lVar8 = (long)plane_from;
  pd = xd->plane + lVar8;
  p = x->plane + lVar8;
  lVar10 = 0;
  lVar4 = 0;
  lVar9 = 0;
  while ((lVar8 <= plane_to && ((lVar8 == 0 || (xd->is_chroma_ref == true))))) {
    bsize_00 = av1_ss_size_lookup[CONCAT71(in_register_00000031,bsize) & 0xffffffff]
               [pd->subsampling_x][pd->subsampling_y];
    bh = (uint)block_size_high[bsize_00];
    if ((xd->mb_to_bottom_edge < 0) &&
       (bh = (xd->mb_to_bottom_edge >> ((char)pd->subsampling_y + 3U & 0x1f)) +
             (uint)block_size_high[bsize_00], (int)bh < 1)) {
      bh = 0;
    }
    bw = (uint)block_size_wide[bsize_00];
    if ((xd->mb_to_right_edge < 0) &&
       (bw = (xd->mb_to_right_edge >> ((char)pd->subsampling_x + 3U & 0x1f)) +
             (uint)block_size_wide[bsize_00], (int)bw < 1)) {
      bw = 0;
    }
    iVar3 = calculate_sse(xd,p,pd,bw,bh);
    bVar5 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar5 = (char)(x->e_mbd).bd - 5;
    }
    if (iVar3 == 0) {
      iVar2 = 0;
      lVar6 = 0;
    }
    else {
      iVar2 = (int)p->dequant_QTX[1] >> (bVar5 & 0x1f);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      dVar11 = (double)(int)(bw * bh);
      sse_norm = (double)iVar3 / dVar11;
      dVar12 = log2(sse_norm / ((double)iVar2 * (double)iVar2));
      av1_model_rd_curvfit(bsize_00,sse_norm,dVar12,&rate_f,&local_40);
      dVar12 = 0.0;
      if (0.0 <= rate_f * dVar11) {
        dVar12 = rate_f * dVar11;
      }
      iVar2 = (int)(dVar12 + 0.5);
      if (iVar2 == 0) {
        iVar2 = 0;
        lVar6 = iVar3 << 4;
      }
      else {
        dVar11 = sse_norm * local_40 * dVar11;
        dVar12 = 0.0;
        if (0.0 <= dVar11) {
          dVar12 = dVar11;
        }
        lVar6 = (long)(dVar12 + 0.5);
        if (iVar3 * 0x800 <= lVar6 * 0x80 + ((long)x->rdmult * (long)iVar2 + 0x100 >> 9)) {
          iVar2 = 0;
          lVar6 = iVar3 << 4;
        }
      }
    }
    if (lVar8 == 0) {
      iVar7 = 0xffffffff;
      if (iVar3 < 0xffffffff) {
        iVar7 = iVar3;
      }
      x->pred_sse[cVar1] = (uint)iVar7;
    }
    if (plane_rate != (int *)0x0) {
      plane_rate[lVar8] = iVar2;
    }
    if (plane_sse != (int64_t *)0x0) {
      plane_sse[lVar8] = iVar3;
    }
    if (plane_dist != (int64_t *)0x0) {
      plane_dist[lVar8] = lVar6;
    }
    lVar10 = lVar10 + iVar3;
    lVar9 = lVar9 + iVar2;
    lVar4 = lVar4 + lVar6;
    lVar8 = lVar8 + 1;
    pd = pd + 1;
    p = p + 1;
  }
  if (skip_txfm_sb != (uint8_t *)0x0) {
    *skip_txfm_sb = lVar9 == 0;
  }
  if (skip_sse_sb != (int64_t *)0x0) {
    *skip_sse_sb = lVar10 << 4;
  }
  *out_rate_sum = (int)lVar9;
  *out_dist_sum = lVar4;
  return;
}

Assistant:

static inline void model_rd_for_sb_with_curvfit(
    const AV1_COMP *const cpi, BLOCK_SIZE bsize, MACROBLOCK *x, MACROBLOCKD *xd,
    int plane_from, int plane_to, int *out_rate_sum, int64_t *out_dist_sum,
    uint8_t *skip_txfm_sb, int64_t *skip_sse_sb, int *plane_rate,
    int64_t *plane_sse, int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    int64_t dist, sse;
    int rate;
    int bw, bh;
    const struct macroblock_plane *const p = &x->plane[plane];
    get_txb_dimensions(xd, plane, plane_bsize, 0, 0, plane_bsize, NULL, NULL,
                       &bw, &bh);

    sse = calculate_sse(xd, p, pd, bw, bh);
    model_rd_with_curvfit(cpi, x, plane_bsize, plane, sse, bw * bh, &rate,
                          &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;

    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
  }

  if (skip_txfm_sb) *skip_txfm_sb = rate_sum == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}